

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall Client::Client(Client *this,string *address,int port)

{
  char cVar1;
  
  (this->super_TCP)._vptr_TCP = (_func_int **)&PTR_Connect_00105d58;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->collocutor)._M_dataplus._M_p = (pointer)&(this->collocutor).field_2;
  (this->collocutor)._M_string_length = 0;
  (this->collocutor).field_2._M_local_buf[0] = '\0';
  (this->ip)._M_dataplus._M_p = (pointer)&(this->ip).field_2;
  (this->ip)._M_string_length = 0;
  (this->ip).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->ip);
  this->port = port;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[!] Write your nickname: ",0x19);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'p');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&this->name,cVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[!] Choose your friend: ",0x18);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'p');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&this->collocutor,cVar1);
  return;
}

Assistant:

Client::Client(std::string address, int port) {
    this->ip = address;
    this->port = port;

    std::cout << "[!] Write your nickname: ";
    std::getline(std::cin, this->name);
    std::cout << "[!] Choose your friend: ";
    std::getline(std::cin, this->collocutor);
}